

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O3

bool SQVM::IsEqual(SQObjectPtr *o1,SQObjectPtr *o2,bool *res)

{
  SQObjectType SVar1;
  SQObjectType SVar2;
  SQObjectValue SVar3;
  bool bVar4;
  SQFloat SVar5;
  SQFloat SVar6;
  
  SVar1 = (o1->super_SQObject)._type;
  SVar2 = (o2->super_SQObject)._type;
  if (SVar1 == SVar2) {
    bVar4 = (o1->super_SQObject)._unVal.pTable == (o2->super_SQObject)._unVal.pTable;
  }
  else if (((SVar1 & SVar2) >> 0x1a & 1) == 0) {
    bVar4 = false;
  }
  else {
    SVar3 = (o1->super_SQObject)._unVal;
    if (SVar1 == OT_INTEGER) {
      SVar5 = (SQFloat)SVar3.nInteger;
    }
    else {
      SVar5 = SVar3.fFloat;
    }
    SVar3 = (o2->super_SQObject)._unVal;
    if (SVar2 == OT_INTEGER) {
      SVar6 = (SQFloat)SVar3.nInteger;
    }
    else {
      SVar6 = SVar3.fFloat;
    }
    bVar4 = (bool)(-(SVar5 == SVar6) & 1);
  }
  *res = bVar4;
  return true;
}

Assistant:

bool SQVM::IsEqual(const SQObjectPtr &o1,const SQObjectPtr &o2,bool &res)
{
    if(type(o1) == type(o2)) {
        res = (_rawval(o1) == _rawval(o2));
    }
    else {
        if(sq_isnumeric(o1) && sq_isnumeric(o2)) {
            res = (tofloat(o1) == tofloat(o2));
        }
        else {
            res = false;
        }
    }
    return true;
}